

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O1

IntVect __thiscall amrex::BATransformer::doiHi(BATransformer *this)

{
  uint uVar1;
  IntVect IVar2;
  
  switch(this->m_bat_type) {
  case null:
  case coarsenRatio:
    return (int  [3])ZEXT812(0);
  case indexType:
  case indexType_coarsenRatio:
    uVar1 = *(uint *)&this->m_op;
    IVar2.vect[2] = uVar1 >> 2 & 1;
    IVar2.vect._0_8_ = CONCAT44(uVar1 >> 1,uVar1) & 0x100000001;
    return (IntVect)IVar2.vect;
  default:
    return (IntVect)*&(this->m_op).m_bndryReg.m_doihi.vect;
  }
}

Assistant:

IntVect doiHi () const noexcept  {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null.doiHi();
        case     BATType::indexType:
            return m_op.m_indexType.doiHi();
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio.doiHi();
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio.doiHi();
        default:
            return m_op.m_bndryReg.doiHi();
        }
    }